

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl.h
# Opt level: O2

void __thiscall
flatbuffers::SymbolTable<flatbuffers::StructDef>::Move
          (SymbolTable<flatbuffers::StructDef> *this,string *oldname,string *newname)

{
  mapped_type pSVar1;
  iterator __position;
  mapped_type *ppSVar2;
  
  __position = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>_>
                       *)this,oldname);
  if ((_Rb_tree_header *)__position._M_node != &(this->dict)._M_t._M_impl.super__Rb_tree_header) {
    pSVar1 = *(mapped_type *)(__position._M_node + 2);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,flatbuffers::StructDef*>,std::_Select1st<std::pair<std::__cxx11::string_const,flatbuffers::StructDef*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,flatbuffers::StructDef*>>>
    ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,flatbuffers::StructDef*>,std::_Select1st<std::pair<std::__cxx11::string_const,flatbuffers::StructDef*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,flatbuffers::StructDef*>>>
                        *)this,__position);
    ppSVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>_>
              ::operator[](&this->dict,newname);
    *ppSVar2 = pSVar1;
    return;
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/idl.h"
                ,0x102,
                "void flatbuffers::SymbolTable<flatbuffers::StructDef>::Move(const std::string &, const std::string &) [T = flatbuffers::StructDef]"
               );
}

Assistant:

void Move(const std::string &oldname, const std::string &newname) {
    auto it = dict.find(oldname);
    if (it != dict.end()) {
      auto obj = it->second;
      dict.erase(it);
      dict[newname] = obj;
    } else {
      FLATBUFFERS_ASSERT(false);
    }
  }